

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  bool bVar2;
  Mat *pMVar3;
  int iVar4;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float w_1;
  int k;
  float val;
  Mat m;
  int q;
  float *kptr;
  float *outptr;
  int j_1;
  int i_1;
  float bias;
  Mat out;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Mat *in_stack_fffffffffffffe70;
  int local_158;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  Mat *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  float *local_118;
  int local_104;
  int local_100;
  Mat local_f8;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  reference local_b0;
  vector<int,_std::allocator<int>_> local_a0;
  int local_84;
  undefined4 local_80;
  Mat local_70;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_20;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x1c);
  local_28 = *(int *)(in_RSI + 0x20);
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RDI + 0x8c) * (*(int *)(in_RDI + 0x84) + -1) + 1;
  local_34 = *(int *)(in_RDI + 0x90) * (*(int *)(in_RDI + 0x88) + -1) + 1;
  local_38 = (local_24 + -1) * *(int *)(in_RDI + 0x94) + local_30;
  local_3c = (local_28 + -1) * *(int *)(in_RDI + 0x98) + local_34;
  local_20 = in_RDX;
  Mat::Mat(&local_70,in_RDX);
  Mat::create(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
              (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),(size_t)in_stack_fffffffffffffe58);
  bVar2 = Mat::empty(in_stack_fffffffffffffe50);
  if (bVar2) {
    local_4 = -100;
    local_80 = 1;
    goto LAB_00116258;
  }
  local_84 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
  std::allocator<int>::allocator((allocator<int> *)0x115caa);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (allocator_type *)in_stack_fffffffffffffe60);
  std::allocator<int>::~allocator((allocator<int> *)0x115cd0);
  local_b0 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,0);
  local_b4 = 0;
  local_b8 = 0;
  local_bc = local_38 * *(int *)(in_RDI + 0x90) - *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x8c);
  for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x88); local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < *(int *)(in_RDI + 0x84); local_c4 = local_c4 + 1) {
      local_b0[local_b4] = local_b8;
      local_b4 = local_b4 + 1;
      local_b8 = *(int *)(in_RDI + 0x8c) + local_b8;
    }
    local_b8 = local_bc + local_b8;
  }
  for (local_c8 = 0; local_c8 < *(int *)(in_RDI + 0x80); local_c8 = local_c8 + 1) {
    Mat::channel(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    if (*(int *)(in_RDI + 0xa4) != 0) {
      Mat::operator[]((Mat *)(in_RDI + 0xe0),local_c8);
    }
    Mat::fill(in_stack_fffffffffffffe60,(float)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    for (local_100 = 0; local_100 < local_28; local_100 = local_100 + 1) {
      for (local_104 = 0; local_104 < local_24; local_104 = local_104 + 1) {
        pMVar3 = (Mat *)Mat::row(&local_f8,local_100 * *(int *)(in_RDI + 0x98));
        iVar4 = local_104 * *(int *)(in_RDI + 0x94);
        in_stack_fffffffffffffe60 = pMVar3;
        in_stack_fffffffffffffe58 = (Mat *)Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xb0));
        local_118 = (float *)((long)&in_stack_fffffffffffffe58->data +
                             (long)(local_84 * local_2c * local_c8) * 4);
        for (in_stack_fffffffffffffee4 = 0; in_stack_fffffffffffffee4 < local_2c;
            in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 + 1) {
          Mat::channel(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
          in_stack_fffffffffffffe50 = (Mat *)Mat::row((Mat *)&stack0xfffffffffffffeb0,local_100);
          fVar1 = *(float *)((long)&in_stack_fffffffffffffe50->data + (long)local_104 * 4);
          for (local_158 = 0; local_158 < local_84; local_158 = local_158 + 1) {
            *(float *)((long)&pMVar3->data + (long)local_b0[local_158] * 4 + (long)iVar4 * 4) =
                 fVar1 * local_118[local_158] +
                 *(float *)((long)&pMVar3->data + (long)local_b0[local_158] * 4 + (long)iVar4 * 4);
          }
          local_118 = local_118 + local_84;
          Mat::~Mat((Mat *)0x1160eb);
        }
      }
    }
    Mat::~Mat((Mat *)0x11613e);
  }
  Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  if ((*(int *)(in_RDI + 0x9c) < 1) && (*(int *)(in_RDI + 0xa0) < 1)) {
LAB_00116224:
    local_4 = 0;
  }
  else {
    copy_cut_border((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                    in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    bVar2 = Mat::empty(in_stack_fffffffffffffe50);
    if (!bVar2) {
      local_38 = local_20->w;
      local_3c = local_20->h;
      goto LAB_00116224;
    }
    local_4 = -100;
  }
  local_80 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60);
LAB_00116258:
  Mat::~Mat((Mat *)0x116265);
  return local_4;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered = top_blob;
    top_blob_bordered.create(outw, outh, num_output);
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }
    }

    top_blob = top_blob_bordered;

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }

    return 0;
}